

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void Diligent::anon_unknown_227::InitPipelineShaderStages
               (VulkanLogicalDevice *LogicalDevice,TShaderStages *ShaderStages,
               vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
               *ShaderModules,
               vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               *Stages)

{
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> *pvVar1;
  reference pvVar2;
  reference pvVar3;
  char (*pacVar4) [32];
  char (*Args_1) [32];
  Char *pCVar5;
  ShaderVkImpl *pSVar6;
  const_reference ppSVar7;
  reference __x;
  size_type sVar8;
  ShaderDesc *pSVar9;
  reference this;
  char (*pacVar10) [38];
  char (*Args_1_00) [38];
  undefined1 local_130 [8];
  string msg_1;
  undefined1 local_f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> SPIRV;
  ShaderVkImpl *pShader;
  size_t i;
  VkShaderModuleCreateInfo ShaderModuleCI;
  VkPipelineShaderStageCreateInfo StageCI;
  undefined1 local_68 [8];
  string msg;
  SHADER_TYPE ShaderType;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *SPIRVs;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> *Shaders;
  size_t s;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *Stages_local;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  *ShaderModules_local;
  TShaderStages *ShaderStages_local;
  VulkanLogicalDevice *LogicalDevice_local;
  
  Shaders = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
             *)0x0;
  while( true ) {
    pvVar1 = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              *)std::
                vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                ::size(ShaderStages);
    if (pvVar1 <= Shaders) break;
    pvVar2 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[](ShaderStages,(size_type)Shaders);
    pvVar1 = &pvVar2->Shaders;
    pvVar2 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[](ShaderStages,(size_type)Shaders);
    pvVar3 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[](ShaderStages,(size_type)Shaders);
    msg.field_2._12_4_ = pvVar3->Type;
    pacVar4 = (char (*) [32])
              std::
              vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              ::size(pvVar1);
    Args_1 = (char (*) [32])
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::size(&pvVar2->SPIRVs);
    if (pacVar4 != Args_1) {
      FormatString<char[26],char[32]>
                ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"InitPipelineShaderStages",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x45);
      std::__cxx11::string::~string((string *)local_68);
    }
    memset(&ShaderModuleCI.pCode,0,0x30);
    ShaderModuleCI.pCode._0_4_ = 0x12;
    ShaderTypeToVkShaderStageFlagBit(msg.field_2._12_4_);
    memset(&i,0,0x28);
    i._0_4_ = 0x10;
    ShaderModuleCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    ShaderModuleCI._4_4_ = 0;
    ShaderModuleCI.pNext._0_4_ = 0;
    pShader = (ShaderVkImpl *)0x0;
    while( true ) {
      pSVar6 = (ShaderVkImpl *)
               std::
               vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ::size(pvVar1);
      if (pSVar6 <= pShader) break;
      ppSVar7 = std::
                vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ::operator[](pvVar1,(size_type)pShader);
      SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppSVar7;
      __x = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[](&pvVar2->SPIRVs,(size_type)pShader);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,__x);
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      ShaderModuleCI._16_8_ = sVar8 << 2;
      ShaderModuleCI.codeSize =
           (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      pSVar9 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                          *)SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      VulkanUtilities::VulkanLogicalDevice::CreateShaderModule
                ((ShaderModuleWrapper *)((long)&msg_1.field_2 + 8),LogicalDevice,
                 (VkShaderModuleCreateInfo *)&i,(pSVar9->super_DeviceObjectAttribs).Name);
      std::
      vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
      ::push_back(ShaderModules,(value_type *)((long)&msg_1.field_2 + 8));
      VulkanUtilities::
      VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>::
      ~VulkanObjectWrapper
                ((VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10> *
                 )((long)&msg_1.field_2 + 8));
      this = std::
             vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             ::back(ShaderModules);
      VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkShaderModule_T_
                ((VulkanObjectWrapper *)this);
      ShaderVkImpl::GetEntryPoint
                ((ShaderVkImpl *)
                 SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ::push_back(Stages,(value_type *)&ShaderModuleCI.pCode);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      pShader = (ShaderVkImpl *)
                ((long)&(pShader->super_ShaderBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                        .super_ObjectBase<Diligent::IShaderVk>.
                        super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.super_IShader.
                        super_IDeviceObject + 1);
    }
    Shaders = (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               *)((long)&(Shaders->
                         super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pacVar10 = (char (*) [38])
             std::
             vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             ::size(ShaderModules);
  Args_1_00 = (char (*) [38])
              std::
              vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              ::size(Stages);
  if (pacVar10 != Args_1_00) {
    FormatString<char[26],char[38]>
              ((string *)local_130,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderModules.size() == Stages.size()",Args_1_00);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"InitPipelineShaderStages",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,100);
    std::__cxx11::string::~string((string *)local_130);
  }
  return;
}

Assistant:

void InitPipelineShaderStages(const VulkanUtilities::VulkanLogicalDevice&        LogicalDevice,
                              PipelineStateVkImpl::TShaderStages&                ShaderStages,
                              std::vector<VulkanUtilities::ShaderModuleWrapper>& ShaderModules,
                              std::vector<VkPipelineShaderStageCreateInfo>&      Stages)
{
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        VkPipelineShaderStageCreateInfo StageCI{};
        StageCI.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        StageCI.pNext = nullptr;
        StageCI.flags = 0; //  reserved for future use
        StageCI.stage = ShaderTypeToVkShaderStageFlagBit(ShaderType);

        VkShaderModuleCreateInfo ShaderModuleCI{};
        ShaderModuleCI.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
        ShaderModuleCI.pNext = nullptr;
        ShaderModuleCI.flags = 0;

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*         pShader = Shaders[i];
            const std::vector<uint32_t> SPIRV   = SPIRVs[i];

            ShaderModuleCI.codeSize = SPIRV.size() * sizeof(uint32_t);
            ShaderModuleCI.pCode    = SPIRV.data();

            ShaderModules.push_back(LogicalDevice.CreateShaderModule(ShaderModuleCI, pShader->GetDesc().Name));

            StageCI.module              = ShaderModules.back();
            StageCI.pName               = pShader->GetEntryPoint();
            StageCI.pSpecializationInfo = nullptr;

            Stages.push_back(StageCI);
        }
    }

    VERIFY_EXPR(ShaderModules.size() == Stages.size());
}